

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  size_type *psVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  TargetType TVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  pointer ppcVar8;
  string destination;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  cmInstallScriptGenerator g;
  string local_170;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_150;
  cmInstallTargetGenerator local_138;
  
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&local_150,&this->GeneratorTargets);
  if (local_150.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_150.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &local_138.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
              _M_string_length;
    ppcVar8 = local_150.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      TVar4 = cmGeneratorTarget::GetType(*ppcVar8);
      if (TVar4 != INTERFACE_LIBRARY) {
        pcVar2 = *ppcVar8;
        local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"PRE_INSTALL_SCRIPT","");
        pcVar6 = cmGeneratorTarget::GetProperty(pcVar2,(string *)&local_138);
        if (local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)psVar1) {
          operator_delete(local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (pcVar6 != (char *)0x0) {
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_138,pcVar6,false,(char *)0x0,false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_138,os,config,configurationTypes);
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_138);
        }
        pcVar3 = ((*ppcVar8)->Target->InstallPath)._M_dataplus._M_p;
        local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)psVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar3,
                   pcVar3 + ((*ppcVar8)->Target->InstallPath)._M_string_length);
        iVar5 = std::__cxx11::string::compare((char *)&local_138);
        if (local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)psVar1) {
          operator_delete(local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (iVar5 != 0) {
          pcVar3 = ((*ppcVar8)->Target->InstallPath)._M_dataplus._M_p;
          local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
               (_func_int **)psVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar3,
                     pcVar3 + ((*ppcVar8)->Target->InstallPath)._M_string_length);
          std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_138);
          if (local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
              (_func_int **)psVar1) {
            operator_delete(local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                            _vptr_cmScriptGenerator,
                            local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                            RuntimeConfigVariable._M_string_length + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_170);
          if (local_170._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)0x0,0x5cb921);
          }
          TVar4 = cmGeneratorTarget::GetType(*ppcVar8);
          if (TVar4 < SHARED_LIBRARY) {
LAB_002cb89a:
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
            cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                      ((cmInstallTargetGeneratorLocal *)&local_138,this,psVar7,
                       local_170._M_dataplus._M_p,false);
            cmScriptGenerator::Generate
                      ((cmScriptGenerator *)&local_138,os,config,configurationTypes);
LAB_002cb902:
            cmInstallTargetGenerator::~cmInstallTargetGenerator(&local_138);
          }
          else {
            if (TVar4 == SHARED_LIBRARY) {
              psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
              cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                        ((cmInstallTargetGeneratorLocal *)&local_138,this,psVar7,
                         local_170._M_dataplus._M_p,false);
              cmScriptGenerator::Generate
                        ((cmScriptGenerator *)&local_138,os,config,configurationTypes);
              goto LAB_002cb902;
            }
            if (TVar4 == MODULE_LIBRARY) goto LAB_002cb89a;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar2 = *ppcVar8;
        local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"POST_INSTALL_SCRIPT","");
        pcVar6 = cmGeneratorTarget::GetProperty(pcVar2,(string *)&local_138);
        if (local_138.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)psVar1) {
          operator_delete(local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_138.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (pcVar6 != (char *)0x0) {
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_138,pcVar6,false,(char *)0x0,false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_138,os,config,configurationTypes);
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_138);
        }
      }
      ppcVar8 = ppcVar8 + 1;
    } while (ppcVar8 !=
             local_150.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_150.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  std::vector<cmGeneratorTarget*> tgts = this->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
       l != tgts.end(); ++l) {
    if ((*l)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = (*l)->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, CM_NULLPTR, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if ((*l)->Target->GetInstallPath() != "") {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = (*l)->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch ((*l)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, (*l)->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, (*l)->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = (*l)->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, (*l)->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, (*l)->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = (*l)->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, CM_NULLPTR, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}